

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_state_ptr lzham::lzham_lib_compress_reinit(lzham_compress_state_ptr p)

{
  bool bVar1;
  lzcompressor *in_RDI;
  lzham_compress_state *pState;
  lzcompressor *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != (lzcompressor *)0x0) {
    bVar1 = lzcompressor::reset(in_RDI);
    if (bVar1) {
      in_RDI[1].m_stats.m_match_truncation_hist[0x2f] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x30] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x31] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x32] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x33] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x34] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x35] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x36] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x49] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x37] = 0;
      in_RDI[1].m_stats.m_match_truncation_hist[0x38] = 0;
      *(undefined1 *)(in_RDI[1].m_stats.m_match_truncation_hist + 0x39) = 0;
      local_8 = in_RDI;
    }
    else {
      local_8 = (lzcompressor *)0x0;
    }
  }
  return local_8;
}

Assistant:

lzham_compress_state_ptr LZHAM_CDECL lzham_lib_compress_reinit(lzham_compress_state_ptr p)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);
      if (pState)
      {
         if (!pState->m_compressor.reset())
         {
            LZHAM_LOG_ERROR(6010);
            return NULL;
         }

         pState->m_pIn_buf = NULL;
         pState->m_pIn_buf_size = NULL;
         pState->m_pOut_buf = NULL;
         pState->m_pOut_buf_size = NULL;
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
         pState->m_comp_data_ofs = 0;
         pState->m_finished_compression = false;
      }

      return pState;
   }